

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O3

void __thiscall helics::FederateState::setProperties(FederateState *this,ActionMessage *cmd)

{
  __atomic_flag_data_type _Var1;
  uint uVar2;
  
  uVar2 = cmd->messageAction + 0xffffff36;
  if ((this->state)._M_i == CREATED) {
    switch(uVar2) {
    case 0:
      do {
        LOCK();
        _Var1 = (this->processing).super___atomic_flag_base._M_i;
        (this->processing).super___atomic_flag_base._M_i = true;
        UNLOCK();
      } while (_Var1 != false);
      setProperty(this,cmd->messageID,(Time)(cmd->actionTime).internalTimeCode);
      break;
    case 1:
      do {
        LOCK();
        _Var1 = (this->processing).super___atomic_flag_base._M_i;
        (this->processing).super___atomic_flag_base._M_i = true;
        UNLOCK();
      } while (_Var1 != false);
      setProperty(this,cmd->messageID,(cmd->dest_handle).hid);
      break;
    case 2:
      do {
        LOCK();
        _Var1 = (this->processing).super___atomic_flag_base._M_i;
        (this->processing).super___atomic_flag_base._M_i = true;
        UNLOCK();
      } while (_Var1 != false);
      setOptionFlag(this,cmd->messageID,SUB41((cmd->flags & 0x20) >> 5,0));
      break;
    default:
      goto switchD_0031db83_caseD_3;
    case 7:
      do {
        LOCK();
        _Var1 = (this->processing).super___atomic_flag_base._M_i;
        (this->processing).super___atomic_flag_base._M_i = true;
        UNLOCK();
      } while (_Var1 != false);
      setInterfaceProperty(this,cmd);
    }
    LOCK();
    (this->processing).super___atomic_flag_base._M_i = false;
    UNLOCK();
  }
  else if ((uVar2 < 8) && ((0x87U >> (uVar2 & 0x1f) & 1) != 0)) {
    addAction(this,cmd);
    return;
  }
switchD_0031db83_caseD_3:
  return;
}

Assistant:

void FederateState::setProperties(const ActionMessage& cmd)
{
    if (state == FederateStates::CREATED) {
        switch (cmd.action()) {
            case CMD_FED_CONFIGURE_FLAG:
                spinlock();
                setOptionFlag(cmd.messageID, checkActionFlag(cmd, indicator_flag));
                unlock();
                break;
            case CMD_FED_CONFIGURE_TIME:
                spinlock();
                setProperty(cmd.messageID, cmd.actionTime);
                unlock();
                break;
            case CMD_FED_CONFIGURE_INT:
                spinlock();
                setProperty(cmd.messageID, cmd.getExtraData());
                unlock();
                break;
            case CMD_INTERFACE_CONFIGURE:
                spinlock();
                setInterfaceProperty(cmd);
                unlock();
                break;
            default:
                break;
        }
    } else {
        switch (cmd.action()) {
            case CMD_FED_CONFIGURE_FLAG:
            case CMD_FED_CONFIGURE_TIME:
            case CMD_FED_CONFIGURE_INT:
            case CMD_INTERFACE_CONFIGURE:
                addAction(cmd);
                break;
            default:
                break;
        }
    }
}